

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_inv(secp256k1_fe *r,secp256k1_fe *x)

{
  ulong uVar1;
  int64_t b;
  int iVar2;
  ulong uVar3;
  secp256k1_modinv64_modinfo *psVar4;
  undefined8 uVar5;
  ulong uVar6;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  char *pcVar7;
  ulong a;
  ulong a_00;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong a_01;
  ulong uVar12;
  ulong uVar13;
  int64_t sign;
  ulong a_02;
  ulong local_1f8;
  long local_1f0;
  uint64_t c1;
  long local_1e0;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  int local_1a8;
  int local_1a4;
  ulong local_1a0;
  ulong local_198;
  int64_t local_190;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 local_108;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 local_b8;
  secp256k1_modinv64_signed62 local_90;
  secp256k1_fe tmp;
  
  local_1a8 = secp256k1_fe_normalizes_to_zero(x);
  secp256k1_fe_verify(x);
  tmp.n[0] = x->n[0];
  tmp.n[1] = x->n[1];
  tmp.n[2] = x->n[2];
  tmp.n[3] = x->n[3];
  tmp.n[4] = x->n[4];
  tmp.magnitude = x->magnitude;
  tmp.normalized = x->normalized;
  secp256k1_fe_normalize(&tmp);
  secp256k1_fe_to_signed62(&local_b8,&tmp);
  d.v[4] = 0;
  d.v[2] = 0;
  d.v[3] = 0;
  d.v[0] = 0;
  d.v[1] = 0;
  local_90.v[3] = 0;
  local_90.v[4] = 0;
  local_90.v[1] = 0;
  local_90.v[2] = 0;
  local_90.v[0] = 1;
  f.v[2] = 0;
  f.v[3] = 0;
  f.v[0] = -0x1000003d1;
  f.v[1] = 0;
  f.v[4] = 0x100;
  g.v[0] = local_b8.v[0];
  g.v[1] = local_b8.v[1];
  g.v[2] = local_b8.v[2];
  g.v[3] = local_b8.v[3];
  local_190 = local_b8.v[4];
  g.v[4] = local_b8.v[4];
  local_198 = local_b8.v[1];
  local_1a0 = local_b8.v[2];
  uVar13 = 0xffffffffffffffff;
  local_1c0 = 0;
  local_1b0 = 0xfffffffefffffc2f;
  sign = 0x100;
  local_1c8 = 0;
  local_1d0 = 0;
  iVar2 = 0;
  uVar10 = local_b8.v[0];
  uVar12 = local_b8.v[3];
  while (uVar1 = local_1b0, iVar2 != 10) {
    a_01 = 8;
    a_00 = 0;
    a = 0;
    uVar3 = local_1b0;
    uVar6 = uVar10;
    a_02 = a_01;
    for (psVar4 = (secp256k1_modinv64_modinfo *)0x3; local_1a4 = iVar2,
        psVar4 != (secp256k1_modinv64_modinfo *)0x3e;
        psVar4 = (secp256k1_modinv64_modinfo *)((long)(psVar4->modulus).v + 1)) {
      if ((uVar3 & 1) == 0) {
        pcVar7 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
        ;
        pcVar9 = "test condition failed: (f & 1) == 1";
        uVar5 = 0xb5;
        goto LAB_0011016b;
      }
      if (a * uVar10 + a_02 * local_1b0 != uVar3 << ((byte)psVar4 & 0x3f)) {
        pcVar7 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
        ;
        pcVar9 = "test condition failed: (u * f0 + v * g0) == f << i";
        uVar5 = 0xb6;
        goto LAB_0011016b;
      }
      if (a_01 * uVar10 + a_00 * local_1b0 != uVar6 << ((byte)psVar4 & 0x3f)) {
        pcVar7 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
        ;
        pcVar9 = "test condition failed: (q * f0 + r * g0) == g << i";
        uVar5 = 0xb7;
        goto LAB_0011016b;
      }
      c1 = (long)uVar13 >> 0x3f;
      local_1f8 = (ulong)((uint)uVar6 & 1);
      uVar11 = -local_1f8;
      uVar8 = c1 & uVar11;
      if ((uVar13 ^ uVar8) - 0x251 < 0xfffffffffffffb61) {
        pcVar7 = 
        "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
        ;
        pcVar9 = "test condition failed: zeta >= -591 && zeta <= 591";
        uVar5 = 0xd2;
        goto LAB_0011016b;
      }
      uVar13 = (uVar13 ^ uVar8) - 1;
      a_01 = a_01 + ((c1 ^ a) - c1 & uVar11);
      a = ((a_01 & uVar8) + a) * 2;
      a_00 = a_00 + ((c1 ^ a_02) - c1 & uVar11);
      a_02 = ((a_00 & uVar8) + a_02) * 2;
      uVar11 = ((c1 ^ uVar3) - c1 & uVar11) + uVar6;
      uVar6 = uVar11 >> 1;
      uVar3 = uVar3 + (uVar11 & uVar8);
    }
    local_1b8 = uVar10;
    local_108.u = a_02;
    local_108.v = a;
    local_108.q = a_00;
    local_108.r = a_01;
    iVar2 = secp256k1_modinv64_det_check_pow2(&local_108,0x41,0);
    if (iVar2 == 0) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = "test condition failed: secp256k1_modinv64_det_check_pow2(t, 65, 0)";
      uVar5 = 0xe0;
      goto LAB_0011016b;
    }
    secp256k1_modinv64_update_de_62(&d,&local_90,&local_108,psVar4);
    iVar2 = secp256k1_modinv64_mul_cmp_62(&f,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar2 < 1) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0";
      uVar5 = 0x25d;
      goto LAB_0011016b;
    }
    iVar2 = secp256k1_modinv64_mul_cmp_62(&f,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar2) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0";
      uVar5 = 0x25e;
      goto LAB_0011016b;
    }
    iVar2 = secp256k1_modinv64_mul_cmp_62(&g,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar2 < 1) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0";
      uVar5 = 0x25f;
      goto LAB_0011016b;
    }
    iVar2 = secp256k1_modinv64_mul_cmp_62(&g,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar2) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0";
      uVar5 = 0x260;
      goto LAB_0011016b;
    }
    c1 = a_02 * uVar1;
    local_1e0 = SUB168(SEXT816((long)a_02) * SEXT816((long)uVar1),8);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,a,local_1b8);
    local_1f8 = a_00 * uVar1;
    local_1f0 = SUB168(SEXT816((long)a_00) * SEXT816((long)uVar1),8);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1f8,a_01,local_1b8);
    if ((c1 & 0x3fffffffffffffff) != 0) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = "test condition failed: (secp256k1_i128_to_u64(&cf) & M62) == 0";
      uVar5 = 0x200;
      goto LAB_0011016b;
    }
    c1 = c1 >> 0x3e | local_1e0 << 2;
    local_1e0 = local_1e0 >> 0x3e;
    if ((local_1f8 & 0x3fffffffffffffff) != 0) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = "test condition failed: (secp256k1_i128_to_u64(&cg) & M62) == 0";
      uVar5 = 0x201;
      goto LAB_0011016b;
    }
    local_1f8 = local_1f8 >> 0x3e | local_1f0 << 2;
    local_1f0 = local_1f0 >> 0x3e;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,a_02,local_1d0);
    uVar10 = local_198;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,a,local_198);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1f8,a_00,local_1d0);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1f8,a_01,uVar10);
    uVar10 = local_1e0 << 2;
    local_1b0 = c1 & 0x3fffffffffffffff;
    local_1e0 = local_1e0 >> 0x3e;
    uVar1 = local_1f0 << 2;
    local_1b8 = local_1f8 & 0x3fffffffffffffff;
    local_1f0 = local_1f0 >> 0x3e;
    local_1f8 = uVar1 | local_1f8 >> 0x3e;
    c1 = uVar10 | c1 >> 0x3e;
    f.v[0] = local_1b0;
    g.v[0] = local_1b8;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,a_02,local_1c8);
    uVar10 = local_1a0;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,a,local_1a0);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1f8,a_00,local_1c8);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1f8,a_01,uVar10);
    uVar10 = local_1e0 << 2;
    local_1d0 = c1 & 0x3fffffffffffffff;
    local_1e0 = local_1e0 >> 0x3e;
    uVar1 = local_1f0 << 2;
    local_198 = local_1f8 & 0x3fffffffffffffff;
    local_1f0 = local_1f0 >> 0x3e;
    local_1f8 = uVar1 | local_1f8 >> 0x3e;
    c1 = uVar10 | c1 >> 0x3e;
    f.v[1] = local_1d0;
    g.v[1] = local_198;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,a_02,local_1c0);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,a,uVar12);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1f8,a_00,local_1c0);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1f8,a_01,uVar12);
    uVar10 = local_1e0 << 2;
    local_1c8 = c1 & 0x3fffffffffffffff;
    local_1e0 = local_1e0 >> 0x3e;
    uVar12 = local_1f0 << 2;
    local_1a0 = local_1f8 & 0x3fffffffffffffff;
    local_1f0 = local_1f0 >> 0x3e;
    local_1f8 = uVar12 | local_1f8 >> 0x3e;
    c1 = uVar10 | c1 >> 0x3e;
    f.v[2] = local_1c8;
    g.v[2] = local_1a0;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,a_02,sign);
    b = local_190;
    secp256k1_i128_accum_mul((secp256k1_int128 *)&c1,a,local_190);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1f8,a_00,sign);
    secp256k1_i128_accum_mul((secp256k1_int128 *)&local_1f8,a_01,b);
    uVar10 = local_1e0 << 2;
    local_1c0 = c1 & 0x3fffffffffffffff;
    local_1e0 = local_1e0 >> 0x3e;
    uVar1 = local_1f0 << 2;
    uVar12 = local_1f8 & 0x3fffffffffffffff;
    local_1f0 = local_1f0 >> 0x3e;
    local_1f8 = uVar1 | local_1f8 >> 0x3e;
    c1 = uVar10 | c1 >> 0x3e;
    f.v[3] = local_1c0;
    g.v[3] = uVar12;
    sign = secp256k1_i128_to_i64((secp256k1_int128 *)&c1);
    f.v[4] = sign;
    local_190 = secp256k1_i128_to_i64((secp256k1_int128 *)&local_1f8);
    g.v[4] = local_190;
    iVar2 = secp256k1_modinv64_mul_cmp_62(&f,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar2 < 1) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, -1) > 0";
      uVar5 = 0x264;
      goto LAB_0011016b;
    }
    iVar2 = secp256k1_modinv64_mul_cmp_62(&f,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar2) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) <= 0";
      uVar5 = 0x265;
      goto LAB_0011016b;
    }
    iVar2 = secp256k1_modinv64_mul_cmp_62(&g,5,&secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar2 < 1) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, -1) > 0";
      uVar5 = 0x266;
      goto LAB_0011016b;
    }
    iVar2 = secp256k1_modinv64_mul_cmp_62(&g,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar2) {
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &modinfo->modulus, 1) < 0";
      uVar5 = 0x267;
      goto LAB_0011016b;
    }
    uVar10 = local_1b8;
    iVar2 = local_1a4 + 1;
  }
  iVar2 = secp256k1_modinv64_mul_cmp_62(&g,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar2 != 0) {
    pcVar7 = 
    "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
    ;
    pcVar9 = 
    "test condition failed: secp256k1_modinv64_mul_cmp_62(&g, 5, &SECP256K1_SIGNED62_ONE, 0) == 0";
    uVar5 = 0x26f;
    goto LAB_0011016b;
  }
  iVar2 = secp256k1_modinv64_mul_cmp_62(&f,5,&SECP256K1_SIGNED62_ONE,-1);
  psVar4 = extraout_RDX;
  if (iVar2 != 0) {
    iVar2 = secp256k1_modinv64_mul_cmp_62(&f,5,&SECP256K1_SIGNED62_ONE,1);
    psVar4 = extraout_RDX_00;
    if (iVar2 != 0) {
      iVar2 = secp256k1_modinv64_mul_cmp_62(&local_b8,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar2 == 0) {
        iVar2 = secp256k1_modinv64_mul_cmp_62(&d,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar2 == 0) {
          iVar2 = secp256k1_modinv64_mul_cmp_62(&f,5,&secp256k1_const_modinfo_fe.modulus,1);
          psVar4 = extraout_RDX_01;
          if (iVar2 == 0) goto LAB_0011004e;
        }
      }
      pcVar7 = 
      "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
      ;
      pcVar9 = 
      "test condition failed: secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, -1) == 0 || secp256k1_modinv64_mul_cmp_62(&f, 5, &SECP256K1_SIGNED62_ONE, 1) == 0 || (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 && secp256k1_modinv64_mul_cmp_62(&f, 5, &modinfo->modulus, 1) == 0)"
      ;
      uVar5 = 0x275;
      goto LAB_0011016b;
    }
  }
LAB_0011004e:
  secp256k1_modinv64_normalize_62(&d,sign,psVar4);
  local_b8.v[4] = d.v[4];
  local_b8.v[2] = d.v[2];
  local_b8.v[3] = d.v[3];
  local_b8.v[0] = d.v[0];
  local_b8.v[1] = d.v[1];
  secp256k1_fe_from_signed62(r,&local_b8);
  r->magnitude = (uint)(0 < x->magnitude);
  r->normalized = 1;
  iVar2 = secp256k1_fe_normalizes_to_zero(r);
  if (iVar2 == local_1a8) {
    secp256k1_fe_verify(r);
    return;
  }
  pcVar7 = 
  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/field_impl.h"
  ;
  pcVar9 = "test condition failed: secp256k1_fe_normalizes_to_zero(r) == input_is_zero";
  uVar5 = 0x192;
LAB_0011016b:
  fprintf(_stderr,"%s:%d: %s\n",pcVar7,uVar5,pcVar9);
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}